

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.cpp
# Opt level: O0

size_t __thiscall axl::sl::Package::append_va(Package *this,Packer *packer,axl_va_list *va)

{
  uchar *puVar1;
  Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *in_RSI;
  ArrayRef<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *in_RDI;
  size_t newSize;
  size_t oldSize;
  size_t size;
  bool result;
  axl_va_list *in_stack_fffffffffffffee8;
  Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *in_stack_fffffffffffffef0;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  size_t local_90;
  size_t local_88;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  long local_30;
  undefined1 local_21;
  Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *local_18;
  size_t local_8;
  
  local_18 = in_RSI;
  axl_va_list::axl_va_list((axl_va_list *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  (*(code *)**(undefined8 **)in_RSI)(local_50,in_RSI,0,&local_30,local_70);
  axl_va_list::~axl_va_list((axl_va_list *)0x183be2);
  axl_va_list::~axl_va_list((axl_va_list *)0x183bef);
  local_88 = ArrayRef<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::getCount(in_RDI);
  local_90 = local_88 + local_30;
  local_21 = Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::setCount
                       (in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
  if ((bool)local_21) {
    puVar1 = Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::p(local_18);
    puVar1 = puVar1 + local_88;
    axl_va_list::axl_va_list((axl_va_list *)local_18,in_stack_fffffffffffffee8);
    (*(code *)**(undefined8 **)local_18)(local_b0,local_18,puVar1,&local_30,local_d0);
    axl_va_list::~axl_va_list((axl_va_list *)0x183ce4);
    axl_va_list::~axl_va_list((axl_va_list *)0x183cee);
    local_8 = local_90;
  }
  else {
    local_8 = local_88;
  }
  return local_8;
}

Assistant:

size_t
Package::append_va(
	Packer* packer,
	axl_va_list va
) {
	bool result;

	size_t size;
	packer->pack_va(NULL, &size, va);

	size_t oldSize = m_buffer.getCount();
	size_t newSize = oldSize + size;

	result = m_buffer.setCount(newSize);
	if (!result)
		return oldSize;

	packer->pack_va(m_buffer.p() + oldSize, &size, va);
	return newSize;
}